

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

int ON_NurbsSpanIndex(int order,int cv_count,double *knot,double t,int side,int hint)

{
  bool bVar1;
  int local_30;
  int local_2c;
  int len;
  int j;
  int hint_local;
  int side_local;
  double t_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  t_local = (double)(knot + (order + -2));
  local_30 = (cv_count - order) + 2;
  if ((hint < 1) || (len = hint, (cv_count - order) + 1 <= hint)) {
    len = 0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (0 < len) {
        bVar1 = *(double *)((long)t_local + (long)(len + -1) * 8) ==
                *(double *)((long)t_local + (long)len * 8);
      }
      if (!bVar1) break;
      len = len + -1;
    }
    if (0 < len) {
      if (*(double *)((long)t_local + (long)len * 8) <= t) {
        if (side < 0) {
          if ((t == *(double *)((long)t_local + (long)len * 8)) &&
             (!NAN(t) && !NAN(*(double *)((long)t_local + (long)len * 8)))) {
            len = len + -1;
          }
        }
        t_local = (double)((long)t_local + (long)len * 8);
        local_30 = local_30 - len;
      }
      else {
        local_30 = len + 1;
        len = 0;
      }
    }
  }
  local_2c = ON_SearchMonotoneArray((double *)t_local,local_30,t);
  if (local_2c < 0) {
    local_2c = 0;
  }
  else if (local_2c < local_30 + -1) {
    if (side < 0) {
      while( true ) {
        bVar1 = false;
        if (0 < local_2c) {
          bVar1 = t == *(double *)((long)t_local + (long)local_2c * 8);
        }
        if (!bVar1) break;
        local_2c = local_2c + -1;
      }
    }
  }
  else {
    local_2c = local_30 + -2;
  }
  return local_2c + len;
}

Assistant:

int ON_NurbsSpanIndex(
          int order,          // (>=2)
          int cv_count,
          const double* knot, // knot[] array or length ON_KnotCount(order,cv_count)
          double t,           // evaluation parameter
          int side,           // side 0 = default, -1 = from below, +1 = from above
          int hint            // hint (or 0 if no hint available)
          )
{
  int j, len;
  
  // shift knot so that domain is knot[0] to knot[len]
  knot += (order-2);
  len = cv_count-order+2;
  
  // see if hint helps 
  if (hint > 0 && hint < len-1) {
    while(hint > 0 && knot[hint-1] == knot[hint]) hint--;
    if (hint > 0) {
      // have knot[hint-1] < knot[hint]
      if (t < knot[hint]) {
        len = hint+1;
        hint = 0;
      }
      else {
        if (side < 0 && t == knot[hint]) 
          hint--;
        knot += hint;
        len -= hint;
      }
    }
  }
  else
    hint = 0;
  
  j = ON_SearchMonotoneArray(knot,len,t);
  if (j < 0)
    j = 0;
  else if (j >= len-1)
    j = len-2;
  else if (side < 0) {
    // if user wants limit from below and t = an internal knot,
    // back up to previous span
    while(j > 0 && t == knot[j]) 
      j--;
  }
  return (j + hint);
}